

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall llvm::yaml::Scanner::scanDirective(Scanner *this)

{
  iterator pcVar1;
  int iVar2;
  int *Position;
  int *Position_00;
  int *piVar3;
  TokenKind TVar4;
  int *Position_01;
  bool bVar5;
  Token T;
  
  unrollIndent(this,-1);
  (this->SimpleKeys).super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>.
  super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
  super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.super_SmallVectorBase.Size
       = 0;
  this->IsSimpleKeyAllowed = false;
  pcVar1 = this->Current;
  consume(this,0x25);
  piVar3 = (int *)this->Current;
  Position = piVar3;
  do {
    Position_01 = Position;
    Position = (int *)skip_ns_char(this,(iterator)Position_01);
  } while (Position != Position_01);
  this->Current = (iterator)Position;
  do {
    Position_00 = (int *)skip_s_white(this,(iterator)Position);
    bVar5 = Position_00 != Position;
    Position = Position_00;
  } while (bVar5);
  this->Current = (iterator)Position_00;
  T.Kind = TK_Error;
  T.Range.Data = (char *)0x0;
  T.Range.Length = 0;
  T.Value._M_dataplus._M_p = (pointer)&T.Value.field_2;
  T.Value._M_string_length = 0;
  T.Value.field_2._M_local_buf[0] = '\0';
  if ((long)Position_01 - (long)piVar3 == 3) {
    iVar2 = bcmp(piVar3,"TAG",3);
    if (iVar2 != 0) goto LAB_0017385a;
    do {
      piVar3 = (int *)skip_ns_char(this,(iterator)Position_00);
      bVar5 = piVar3 != Position_00;
      Position_00 = piVar3;
    } while (bVar5);
    this->Current = (iterator)piVar3;
    do {
      Position_00 = (int *)skip_s_white(this,(iterator)piVar3);
      bVar5 = Position_00 != piVar3;
      piVar3 = Position_00;
    } while (bVar5);
    this->Current = (iterator)Position_00;
    TVar4 = TK_TagDirective;
    do {
      piVar3 = Position_00;
      Position_00 = (int *)skip_ns_char(this,(iterator)piVar3);
    } while (Position_00 != piVar3);
  }
  else {
    if (((long)Position_01 - (long)piVar3 != 4) || (*piVar3 != 0x4c4d4159)) {
LAB_0017385a:
      bVar5 = false;
      goto LAB_001738cf;
    }
    TVar4 = TK_VersionDirective;
    do {
      piVar3 = Position_00;
      Position_00 = (int *)skip_ns_char(this,(iterator)piVar3);
    } while (Position_00 != piVar3);
  }
  this->Current = (iterator)Position_00;
  T.Range.Length = (long)piVar3 - (long)pcVar1;
  T.Kind = TVar4;
  T.Range.Data = pcVar1;
  AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
  ::push_back(&this->TokenQueue,&T);
  bVar5 = true;
LAB_001738cf:
  std::__cxx11::string::_M_dispose();
  return bVar5;
}

Assistant:

bool Scanner::scanDirective() {
  // Reset the indentation level.
  unrollIndent(-1);
  SimpleKeys.clear();
  IsSimpleKeyAllowed = false;

  StringRef::iterator Start = Current;
  consume('%');
  StringRef::iterator NameStart = Current;
  Current = skip_while(&Scanner::skip_ns_char, Current);
  StringRef Name(NameStart, Current - NameStart);
  Current = skip_while(&Scanner::skip_s_white, Current);

  Token T;
  if (Name == "YAML") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_VersionDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  } else if(Name == "TAG") {
    Current = skip_while(&Scanner::skip_ns_char, Current);
    Current = skip_while(&Scanner::skip_s_white, Current);
    Current = skip_while(&Scanner::skip_ns_char, Current);
    T.Kind = Token::TK_TagDirective;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    return true;
  }
  return false;
}